

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_check_collapse.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::check_collapse_class
          (Omega_h *this,Mesh *mesh,LOs *cands2edges,Read<signed_char> *cand_codes)

{
  Alloc *pAVar1;
  ulong uVar2;
  void *extraout_RDX;
  byte bVar3;
  Int ent_dim;
  uint uVar4;
  int iVar5;
  Int eev;
  long lVar6;
  uint size_in;
  size_t sVar7;
  Read<signed_char> RVar8;
  int local_1b8 [2];
  Write<signed_char> cand_codes_w;
  string local_1a0;
  Write<int> local_180;
  Write<signed_char> local_170;
  Write<signed_char> local_160;
  Write<signed_char> local_150;
  Alloc *local_140;
  Write<signed_char> local_138;
  LOs edge_verts2verts;
  Read<signed_char> edges2class_dim;
  Read<signed_char> verts2class_dim;
  LO eev2v [2];
  Write<signed_char> local_f0;
  Write<int> local_e0;
  Write<int> local_d0;
  Write<signed_char> local_c0;
  Write<signed_char> local_b0;
  Write<signed_char> local_a0;
  type f;
  
  pAVar1 = (cands2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar7 = pAVar1->size;
  }
  else {
    sVar7 = (ulong)pAVar1 >> 3;
  }
  local_140 = (Alloc *)this;
  std::__cxx11::string::string((string *)&local_1a0,"class_dim",(allocator *)&local_f0);
  ent_dim = (Int)mesh;
  Mesh::get_array<signed_char>((Mesh *)&verts2class_dim,ent_dim,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::string((string *)&local_1a0,"class_dim",(allocator *)&local_f0);
  Mesh::get_array<signed_char>((Mesh *)&edges2class_dim,ent_dim,(string *)0x1);
  std::__cxx11::string::~string((string *)&local_1a0);
  Mesh::ask_verts_of((Mesh *)&edge_verts2verts,ent_dim);
  std::__cxx11::string::string((string *)&local_1a0,"",(allocator *)&local_f0);
  size_in = (uint)(sVar7 >> 2);
  Write<signed_char>::Write(&cand_codes_w,size_in,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  Write<signed_char>::Write((Write<signed_char> *)&f,&cand_codes->write_);
  Write<int>::Write(&f.cands2edges.write_,&cands2edges->write_);
  Write<int>::Write(&f.edge_verts2verts.write_,&edge_verts2verts.write_);
  Write<signed_char>::Write(&f.verts2class_dim.write_,&verts2class_dim.write_);
  Write<signed_char>::Write(&f.edges2class_dim.write_,&edges2class_dim.write_);
  Write<signed_char>::Write(&f.cand_codes_w,&cand_codes_w);
  Write<signed_char>::Write(&local_f0,(Write<signed_char> *)&f);
  Write<int>::Write(&local_e0,&f.cands2edges.write_);
  Write<int>::Write(&local_d0,&f.edge_verts2verts.write_);
  Write<signed_char>::Write(&local_c0,&f.verts2class_dim.write_);
  Write<signed_char>::Write(&local_b0,&f.edges2class_dim.write_);
  Write<signed_char>::Write(&local_a0,&f.cand_codes_w);
  if (0 < (int)size_in) {
    entering_parallel = 1;
    Write<signed_char>::Write((Write<signed_char> *)&local_1a0,&local_f0);
    Write<int>::Write((Write<int> *)&local_1a0.field_2,&local_e0);
    Write<int>::Write(&local_180,&local_d0);
    Write<signed_char>::Write(&local_170,&local_c0);
    Write<signed_char>::Write(&local_160,&local_b0);
    Write<signed_char>::Write(&local_150,&local_a0);
    entering_parallel = 0;
    for (uVar2 = 0; uVar2 != (size_in & 0x7fffffff); uVar2 = uVar2 + 1) {
      bVar3 = *(byte *)(local_1a0._M_string_length + uVar2);
      uVar4 = (uint)(char)bVar3;
      iVar5 = *(int *)(local_1a0.field_2._8_8_ + uVar2 * 4);
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        eev2v[lVar6] = *(LO *)((long)local_180.shared_alloc_.direct_ptr +
                              lVar6 * 4 + (long)(iVar5 * 2) * 4);
      }
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        local_1b8[lVar6] =
             (int)*(char *)((long)local_170.shared_alloc_.direct_ptr + (long)eev2v[lVar6]);
      }
      iVar5 = (int)*(char *)((long)local_160.shared_alloc_.direct_ptr + (long)iVar5);
      if (local_1b8[0] == local_1b8[1]) {
        if (local_1b8[0] != iVar5) {
          bVar3 = 0;
        }
      }
      else {
        for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
          if (((uVar4 >> ((uint)lVar6 & 0x1f) & 1) != 0) && (local_1b8[lVar6] != iVar5)) {
            bVar3 = bVar3 & ~(byte)(1 << ((byte)lVar6 & 0x1f));
          }
        }
      }
      *(byte *)((long)local_150.shared_alloc_.direct_ptr + uVar2) = bVar3;
    }
    check_collapse_class(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
              ((__0 *)&local_1a0);
  }
  check_collapse_class(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&local_f0);
  Write<signed_char>::Write(&local_138,&cand_codes_w);
  pAVar1 = local_140;
  Read<signed_char>::Read((Read<signed_char> *)local_140,&local_138);
  Write<signed_char>::~Write(&local_138);
  check_collapse_class(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>)::$_0::~__0
            ((__0 *)&f);
  Write<signed_char>::~Write(&cand_codes_w);
  Write<int>::~Write(&edge_verts2verts.write_);
  Write<signed_char>::~Write(&edges2class_dim.write_);
  Write<signed_char>::~Write(&verts2class_dim.write_);
  RVar8.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar8.write_.shared_alloc_.alloc = pAVar1;
  return (Read<signed_char>)RVar8.write_.shared_alloc_;
}

Assistant:

Read<I8> check_collapse_class(
    Mesh* mesh, LOs cands2edges, Read<I8> cand_codes) {
  auto ncands = cands2edges.size();
  auto verts2class_dim = mesh->get_array<I8>(VERT, "class_dim");
  auto edges2class_dim = mesh->get_array<I8>(EDGE, "class_dim");
  auto edge_verts2verts = mesh->ask_verts_of(EDGE);
  auto cand_codes_w = Write<I8>(ncands);
  auto f = OMEGA_H_LAMBDA(LO cand) {
    auto code = cand_codes[cand];
    auto edge = cands2edges[cand];
    LO eev2v[2];
    for (Int eev = 0; eev < 2; ++eev)
      eev2v[eev] = edge_verts2verts[edge * 2 + eev];
    Int eev_cd[2];
    for (Int eev = 0; eev < 2; ++eev) eev_cd[eev] = verts2class_dim[eev2v[eev]];
    Int e_cd = edges2class_dim[edge];
    /* if both vertices are classified onto the same dimension,
       the edge must also be classified onto that dimension */
    if (eev_cd[0] == eev_cd[1]) {
      if (eev_cd[0] != e_cd) code = DONT_COLLAPSE;
    } else {
      for (Int col_v = 0; col_v < 2; ++col_v) {
        if (collapses(cand_codes[cand], col_v)) {
          /* otherwise, the vertex to collapse and the edge must
             be classified onto the same dimension */
          if (eev_cd[col_v] != e_cd) {
            code = dont_collapse(code, col_v);
          }
        }
      }
    }
    cand_codes_w[cand] = code;
  };
  parallel_for(ncands, f, "check_collapse_class");
  return cand_codes_w;
}